

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caniter.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::CanonicalIterator::next(UnicodeString *__return_storage_ptr__,CanonicalIterator *this)

{
  int local_1c;
  int32_t i;
  CanonicalIterator *this_local;
  
  if (this->done == '\0') {
    UnicodeString::remove(&this->buffer,(char *)this);
    for (local_1c = 0; local_1c < this->pieces_length; local_1c = local_1c + 1) {
      UnicodeString::append(&this->buffer,this->pieces[local_1c] + this->current[local_1c]);
    }
    local_1c = this->current_length;
    while (local_1c = local_1c + -1, -1 < local_1c) {
      this->current[local_1c] = this->current[local_1c] + 1;
      if (this->current[local_1c] < this->pieces_lengths[local_1c]) goto LAB_00318197;
      this->current[local_1c] = 0;
    }
    this->done = '\x01';
LAB_00318197:
    UnicodeString::UnicodeString(__return_storage_ptr__,&this->buffer);
  }
  else {
    UnicodeString::setToBogus(&this->buffer);
    UnicodeString::UnicodeString(__return_storage_ptr__,&this->buffer);
  }
  return __return_storage_ptr__;
}

Assistant:

UnicodeString CanonicalIterator::next() {
    int32_t i = 0;

    if (done) {
      buffer.setToBogus();
      return buffer;
    }

    // delete old contents
    buffer.remove();

    // construct return value

    for (i = 0; i < pieces_length; ++i) {
        buffer.append(pieces[i][current[i]]);
    }
    //String result = buffer.toString(); // not needed

    // find next value for next time

    for (i = current_length - 1; ; --i) {
        if (i < 0) {
            done = TRUE;
            break;
        }
        current[i]++;
        if (current[i] < pieces_lengths[i]) break; // got sequence
        current[i] = 0;
    }
    return buffer;
}